

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O1

void Dar_LibObjPrint_rec(Dar_LibObj_t *pObj)

{
  int __c;
  
  if ((pObj->field_0x4 & 8) == 0) {
    putchar(0x28);
    Dar_LibObjPrint_rec(s_DarLib->pObjs + *(ushort *)pObj);
    if ((pObj->field_0x4 & 1) != 0) {
      putchar(0x27);
    }
    Dar_LibObjPrint_rec(s_DarLib->pObjs + *(ushort *)&pObj->field_0x2);
    __c = 0x29;
    if (((ulong)*pObj & 0x100000000) != 0) {
      putchar(0x27);
    }
  }
  else {
    __c = (int)((ulong)((long)pObj - (long)s_DarLib->pObjs) >> 3) + 0x61;
  }
  putchar(__c);
  return;
}

Assistant:

void Dar_LibObjPrint_rec( Dar_LibObj_t * pObj )
{
    if ( pObj->fTerm )
    {
        printf( "%c", 'a' + (int)(pObj - s_DarLib->pObjs) );
        return;
    }
    printf( "(" );
    Dar_LibObjPrint_rec( Dar_LibObj(s_DarLib, pObj->Fan0) );
    if ( pObj->fCompl0 )
        printf( "\'" );
    Dar_LibObjPrint_rec( Dar_LibObj(s_DarLib, pObj->Fan1) );
    if ( pObj->fCompl0 )
        printf( "\'" );
    printf( ")" );
}